

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void algorithm_suite::move_sequence(void)

{
  initializer_list<double> __l;
  value_type local_70;
  undefined8 local_68;
  vector<double,_std::allocator<double>_> input;
  moment<double> filter;
  
  filter.member.mean = 1.0;
  filter.member.count = 0x4000000000000000;
  __l._M_len = 5;
  __l._M_array = (iterator)&filter;
  std::vector<double,_std::allocator<double>_>::vector(&input,__l,(allocator_type *)&local_70);
  filter.member.mean = 0.0;
  filter.member.count = 0;
  std::__copy_move<true,false,std::random_access_iterator_tag>::
  __copy_m<double*,trial::online::push_iterator<trial::online::cumulative::basic_moment<double,(trial::online::with)1>>>
            (input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish,&filter);
  local_70 = (value_type)filter.member.count;
  local_68 = CONCAT44(local_68._4_4_,5);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2ee,"void algorithm_suite::move_sequence()",&local_70,&local_68);
  local_70 = filter.member.mean;
  local_68 = 0x4008000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","3.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x2ef,"void algorithm_suite::move_sequence()",&local_70,&local_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&input.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void move_sequence()
{
    std::vector<double> input = { 1.0, 2.0, 3.0, 4.0, 5.0 };
    cumulative::moment<double> filter;
    std::move(input.begin(), input.end(), push_inserter(filter));
    TRIAL_TEST_EQ(filter.size(), 5);
    TRIAL_TEST_EQ(filter.mean(), 3.0);
}